

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool useReturnPeriodFile;
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  string *psVar5;
  char local_1d6 [2];
  undefined4 local_1d4;
  allocator local_1ce;
  allocator local_1cd;
  undefined4 local_1cc;
  bool outputFlags [8];
  string local_1b8;
  FILE *fout [2];
  string local_188;
  string subfolder;
  string parquetOutFiles [2];
  string local_108;
  string local_e8;
  sigaction sa;
  
  fout[0] = (FILE *)0x0;
  fout[1] = (FILE *)0x0;
  outputFlags[0] = false;
  outputFlags[1] = false;
  outputFlags[2] = false;
  outputFlags[3] = false;
  outputFlags[4] = false;
  outputFlags[5] = false;
  outputFlags[6] = false;
  outputFlags[7] = false;
  std::__cxx11::string::string((string *)parquetOutFiles,"",(allocator *)&sa);
  std::__cxx11::string::string((string *)(parquetOutFiles + 1),"",(allocator *)&subfolder);
  subfolder._M_dataplus._M_p = (pointer)&subfolder.field_2;
  subfolder._M_string_length = 0;
  subfolder.field_2._M_local_buf[0] = '\0';
  local_1cc = 0;
  local_1d4 = 0;
  useReturnPeriodFile = false;
  lVar4 = 0;
switchD_0010f4df_caseD_48:
  lVar3 = lVar4;
  iVar2 = getopt(argc,argv,"vhrHFWMSK:fwsmO:o:P:p:");
  if (iVar2 - 0x46U < 0x12) goto code_r0x0010f4d1;
  if (0x11 < iVar2 - 0x66U) {
    if (iVar2 == -1) {
      local_1d6[1] = (char)local_1cc;
      local_1d6[0] = (char)local_1d4;
      if (argc == 1) {
        fwrite("FATAL: Invalid parameters\n",0x1a,1,_stderr);
        help();
      }
      psVar5 = parquetOutFiles;
      lVar4 = 0;
      goto LAB_0010f631;
    }
    goto switchD_0010f4df_caseD_47;
  }
  lVar4 = (long)&switchD_0010f4fe::switchdataD_00110744 +
          (long)(int)(&switchD_0010f4fe::switchdataD_00110744)[iVar2 - 0x66U];
  switch(iVar2) {
  case 0x66:
    outputFlags[4] = true;
    break;
  default:
    goto switchD_0010f4df_caseD_47;
  case 0x68:
    goto switchD_0010f4fe_caseD_68;
  case 0x6d:
    outputFlags[7] = true;
    break;
  case 0x6f:
    std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1b8);
    iVar2 = 1;
    goto LAB_0010f577;
  case 0x70:
    psVar5 = parquetOutFiles + 1;
    goto switchD_0010f4df_caseD_4b;
  case 0x72:
    useReturnPeriodFile = true;
    lVar4 = lVar3;
    goto switchD_0010f4df_caseD_48;
  case 0x73:
    outputFlags[6] = true;
    break;
  case 0x76:
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
    goto LAB_0010f943;
  case 0x77:
    outputFlags[5] = true;
    goto LAB_0010f5b5;
  }
  goto LAB_0010f5e7;
code_r0x0010f4d1:
  lVar4 = CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
  psVar5 = &subfolder;
  switch(iVar2) {
  case 0x46:
    outputFlags[0] = true;
    break;
  default:
    goto switchD_0010f4df_caseD_47;
  case 0x48:
    goto switchD_0010f4df_caseD_48;
  case 0x4d:
    outputFlags[3] = true;
    break;
  case 0x4f:
    std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_1b8);
    iVar2 = 0;
LAB_0010f577:
    openpipe(iVar2,(string *)&sa,fout);
    std::__cxx11::string::~string((string *)&sa);
    lVar4 = lVar3;
    goto switchD_0010f4df_caseD_48;
  case 0x50:
    psVar5 = parquetOutFiles;
  case 0x4b:
switchD_0010f4df_caseD_4b:
    std::__cxx11::string::assign((char *)psVar5);
    lVar4 = lVar3;
    goto switchD_0010f4df_caseD_48;
  case 0x53:
    outputFlags[2] = true;
    break;
  case 0x57:
    outputFlags[1] = true;
LAB_0010f5b5:
    local_1cc = (undefined4)CONCAT71((int7)((ulong)lVar4 >> 8),1);
    lVar4 = lVar3;
    goto switchD_0010f4df_caseD_48;
  }
LAB_0010f5e7:
  local_1d4 = (undefined4)CONCAT71((int7)((ulong)lVar4 >> 8),1);
  lVar4 = lVar3;
  goto switchD_0010f4df_caseD_48;
LAB_0010f631:
  if (lVar4 == 2) {
    progname = *argv;
    memset(&sa,0,0x98);
    sigemptyset((sigset_t *)&sa.sa_mask);
    sa.__sigaction_handler.sa_handler = segfault_sigaction;
    sa.sa_flags = 4;
    sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
    std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&local_1b8);
    std::__cxx11::string::string((string *)&local_108,"",(allocator *)&local_188);
    initstreams(&local_e8,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::string((string *)&local_1b8,progname,&local_1cd);
    std::__cxx11::string::string((string *)&local_188,"INFO",&local_1ce);
    logprintf(&local_1b8,&local_188,"starting process..\n");
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1b8);
    leccalc::doit(&subfolder,fout,useReturnPeriodFile,SUB81(lVar3,0),outputFlags,true,
                  parquetOutFiles,progname);
    std::__cxx11::string::string((string *)&local_1b8,progname,&local_1cd);
    std::__cxx11::string::string((string *)&local_188,"INFO",&local_1ce);
    logprintf(&local_1b8,&local_188,"finishing process..\n");
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&subfolder);
    lVar4 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&parquetOutFiles[0]._M_dataplus._M_p + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    return 0;
  }
  sa.__sigaction_handler.sa_handler = (__sighandler_t)(sa.sa_mask.__val + 1);
  sa.sa_mask.__val[0] = 0;
  sa.sa_mask.__val[1]._0_1_ = 0;
  std::__cxx11::string::assign((char *)&sa);
  if (local_1d6[lVar4] == '\0') {
    if ((fout[lVar4] != (FILE *)0x0) || (bVar1 = std::operator!=(psVar5,""), bVar1)) {
      fprintf(_stderr,"WARNING: no valid output stream to fill %s file.\n",
              sa.__sigaction_handler.sa_handler);
    }
  }
  else if ((fout[lVar4] == (FILE *)0x0) && (bVar1 = std::operator==(psVar5,""), bVar1)) {
    fprintf(_stderr,"FATAL: no destination for %s output.\n",sa.__sigaction_handler.sa_handler);
    goto LAB_0010f943;
  }
  bVar1 = std::operator!=(psVar5,"");
  if (bVar1) {
    fwrite("FATAL: Apache arrow libraries for parquet output are missing.\n Please install libraries and recompile to use this option.\n"
           ,0x7a,1,_stderr);
    goto LAB_0010f943;
  }
  std::__cxx11::string::~string((string *)&sa);
  lVar4 = lVar4 + 1;
  psVar5 = psVar5 + 1;
  goto LAB_0010f631;
switchD_0010f4df_caseD_47:
switchD_0010f4fe_caseD_68:
  help();
LAB_0010f943:
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
	bool useReturnPeriodFile = false;
	FILE* fout[] = { nullptr, nullptr };
	bool outputFlags[8] = { false, false, false, false,
				false, false, false, false };
	const int maxStreams = 2;
	std::string parquetOutFiles[maxStreams] = { "", "" };
	bool outputStreams[maxStreams] = { false, false };
	const bool ordFlag = true;   // Turn on ORD output

	std::string subfolder;
	int opt;
	bool skipheader = false;
	while ((opt = getopt(argc, argv, "vhrHFWMSK:fwsmO:o:P:p:")) != -1) {
		switch (opt) {
		case 'K':
			subfolder = optarg;
			break;
		case 'H':
			skipheader = true;
			break;
		case 'F':
			outputFlags[AGG_FULL_UNCERTAINTY] = true;
			outputStreams[EPT] = true;
			break;
		case 'f':
			outputFlags[OCC_FULL_UNCERTAINTY] = true;
			outputStreams[EPT] = true;
			break;
		case 'W':
			outputFlags[AGG_WHEATSHEAF] = true;
			outputStreams[PSEPT] = true;
			break;
		case 'w':
			outputFlags[OCC_WHEATSHEAF] = true;
			outputStreams[PSEPT] = true;
			break;
		case 'S':
			outputFlags[AGG_SAMPLE_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 's':
			outputFlags[OCC_SAMPLE_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'M':
			outputFlags[AGG_WHEATSHEAF_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'm':
			outputFlags[OCC_WHEATSHEAF_MEAN] = true;
			outputStreams[EPT] = true;
			break;
		case 'r':
			useReturnPeriodFile = true;
			break;
		case 'O':
			openpipe(EPT, optarg, fout);
			break;
		case 'o':
			openpipe(PSEPT, optarg, fout);
			break;
		case 'P':
			parquetOutFiles[EPT] = optarg;
			break;
		case 'p':
			parquetOutFiles[PSEPT] = optarg;
			break;
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			::exit(EXIT_FAILURE);
			break;
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

	if (argc == 1) {
		fprintf(stderr, "FATAL: Invalid parameters\n");
		help();
	}

	// Check for valid combinations of output streams and ORD files
	for (int i = 0; i < maxStreams; i++) {
		std::string streamName;
		if (i == EPT) streamName = "EPT";
		else if (i == PSEPT) streamName = "PSEPT";
		else streamName = "Error";   // Should never get here

		if (outputStreams[i] == false && 
		    (fout[i] != nullptr || parquetOutFiles[i] != "")) {
			fprintf(stderr, "WARNING: no valid output stream to fill %s file.\n",
				streamName.c_str());
		} else if (outputStreams[i] == true && fout[i] == nullptr
			   && parquetOutFiles[i] == "") {
			fprintf(stderr, "FATAL: no destination for %s output.\n",
				streamName.c_str());
			exit(EXIT_FAILURE);
		}
#ifndef HAVE_PARQUET
		if (parquetOutFiles[i] != "") {
			fprintf(stderr, "FATAL: Apache arrow libraries for "
					"parquet output are missing.\n Please "
					"install libraries and recompile to "
					"use this option.\n");
			exit(EXIT_FAILURE);
		}
#endif
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
        	logprintf(progname, "INFO", "starting process..\n");
		leccalc::doit(subfolder, fout, useReturnPeriodFile, skipheader,
			      outputFlags, ordFlag, parquetOutFiles, progname);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	} catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}